

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int unknown_isName(ENCODING *enc,char *p)

{
  uint uVar1;
  char *in_RDX;
  int c;
  char *p_local;
  ENCODING *enc_local;
  
  uVar1 = (*enc[3].literalScanners[1])((ENCODING *)enc[3].sameName,p,in_RDX,(char **)enc);
  if ((uVar1 & 0xffff0000) == 0) {
    enc_local._4_4_ =
         namingBitmap
         [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(int)uVar1 >> 8] * 8 +
               ((int)(uVar1 & 0xff) >> 5))] & 1 << ((byte)uVar1 & 0x1f);
  }
  else {
    enc_local._4_4_ = 0;
  }
  return enc_local._4_4_;
}

Assistant:

static
int unknown_isName(const ENCODING *enc, const char *p)
{
  int c = ((const struct unknown_encoding *)enc)
          ->convert(((const struct unknown_encoding *)enc)->userData, p);
  if (c & ~0xFFFF)
    return 0;
  return UCS2_GET_NAMING(namePages, c >> 8, c & 0xFF);
}